

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  char cVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  float *pfVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  EXRImage exrImage;
  EXRImage local_1098;
  
  if (out_rgba == (float **)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar7 = "Invalid argument.\n";
  }
  else {
    local_1098.images = (uchar **)0x0;
    local_1098.pixel_types = (int *)0x0;
    local_1098.num_custom_attributes = 0;
    local_1098.num_channels = 0;
    local_1098.channel_names = (char **)0x0;
    local_1098.requested_pixel_types = (int *)0x0;
    iVar5 = ParseMultiChannelEXRHeaderFromFile(&local_1098,filename,err);
    if (iVar5 != 0) {
      return iVar5;
    }
    if (0 < local_1098.num_channels) {
      lVar10 = 0;
      do {
        if (local_1098.pixel_types[lVar10] == 1) {
          local_1098.requested_pixel_types[lVar10] = 2;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_1098.num_channels);
    }
    iVar5 = LoadMultiChannelEXRFromFile(&local_1098,filename,err);
    if (iVar5 != 0) {
      return iVar5;
    }
    if (0 < (long)local_1098.num_channels) {
      uVar9 = 0xffffffff;
      uVar8 = 0;
      uVar13 = 0xffffffff;
      uVar11 = 0xffffffff;
      uVar12 = 0xffffffff;
      do {
        pcVar7 = local_1098.channel_names[uVar8];
        cVar1 = *pcVar7;
        if (cVar1 == 'R') {
          if (pcVar7[1] == '\0') {
            uVar12 = uVar8 & 0xffffffff;
          }
        }
        else if (cVar1 == 'A') {
          if (pcVar7[1] == '\0') {
            uVar9 = uVar8 & 0xffffffff;
          }
        }
        else if (cVar1 == 'B') {
          if (pcVar7[1] == '\0') {
            uVar13 = uVar8 & 0xffffffff;
          }
        }
        else if ((cVar1 == 'G') && (pcVar7[1] == '\0')) {
          uVar11 = uVar8 & 0xffffffff;
        }
        uVar8 = uVar8 + 1;
      } while ((long)local_1098.num_channels != uVar8);
      if ((int)uVar12 != -1) {
        if ((int)uVar11 == -1) {
          if (err == (char **)0x0) {
            return -1;
          }
          pcVar7 = "G channel not found\n";
        }
        else {
          if ((int)uVar13 != -1) {
            pfVar6 = (float *)malloc((long)local_1098.width * (long)local_1098.height * 0x10);
            *out_rgba = pfVar6;
            if (0 < local_1098.height * local_1098.width) {
              puVar2 = local_1098.images[(int)uVar12];
              puVar3 = local_1098.images[(int)uVar11];
              puVar4 = local_1098.images[(int)uVar13];
              lVar10 = 0;
              do {
                pfVar6[lVar10] = *(float *)(puVar2 + lVar10);
                pfVar6[lVar10 + 1] = *(float *)(puVar3 + lVar10);
                pfVar6[lVar10 + 2] = *(float *)(puVar4 + lVar10);
                fVar14 = 1.0;
                if (0 < (int)uVar9) {
                  fVar14 = *(float *)(local_1098.images[uVar9] + lVar10);
                }
                pfVar6[lVar10 + 3] = fVar14;
                lVar10 = lVar10 + 4;
              } while ((ulong)(uint)(local_1098.height * local_1098.width) << 2 != lVar10);
            }
            *width = local_1098.width;
            *height = local_1098.height;
            return 0;
          }
          if (err == (char **)0x0) {
            return -1;
          }
          pcVar7 = "B channel not found\n";
        }
        goto LAB_001953a5;
      }
    }
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar7 = "R channel not found\n";
  }
LAB_001953a5:
  *err = pcVar7;
  return -1;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {

  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);

  {
    int ret = ParseMultiChannelEXRHeaderFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exrImage.num_channels; i++) {
    if (exrImage.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exrImage.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadMultiChannelEXRFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  (*out_rgba) =
      (float *)malloc(4 * sizeof(float) * exrImage.width * exrImage.height);
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exrImage.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exrImage.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exrImage.width;
  (*height) = exrImage.height;

  // @todo { free exrImage }
  return 0;
}